

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

IceTSparseImage icetSparseImageAssignBuffer(IceTVoid *buffer,IceTSizeType width,IceTSizeType height)

{
  IceTEnum IVar1;
  undefined8 in_RAX;
  IceTEnum IVar2;
  IceTPointerArithmetic buffer_begin;
  IceTEnum color_format;
  IceTEnum local_24;
  
  if (buffer == (IceTVoid *)0x0) {
    icetRaiseDiagnostic("Tried to create sparse image with NULL buffer.",0xfffffffa,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                        ,0x191);
  }
  else {
    _color_format = in_RAX;
    icetGetEnumv(9,&color_format);
    icetGetEnumv(10,&local_24);
    IVar1 = color_format;
    if (color_format - 0xc003 < 0xfffffffd) {
      icetRaiseDiagnostic("Invalid color format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x19d);
      _color_format = CONCAT44(local_24,0xc000);
      IVar1 = 0xc000;
    }
    IVar2 = local_24;
    if (local_24 - 0xd002 < 0xfffffffe) {
      icetRaiseDiagnostic("Invalid depth format.",0xfffffffe,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,0x1a2);
      IVar2 = 0xd000;
      IVar1 = color_format;
    }
    *(undefined4 *)buffer = 0x4d6000;
    *(IceTEnum *)((long)buffer + 4) = IVar1;
    *(IceTEnum *)((long)buffer + 8) = IVar2;
    *(IceTSizeType *)((long)buffer + 0xc) = width;
    *(IceTSizeType *)((long)buffer + 0x10) = height;
    *(IceTSizeType *)((long)buffer + 0x14) = height * width;
    *(IceTSizeType *)((long)buffer + 0x1c) = height * width;
    *(undefined4 *)((long)buffer + 0x20) = 0;
    *(undefined4 *)((long)buffer + 0x18) = 0x24;
  }
  return (IceTSparseImage)buffer;
}

Assistant:

IceTSparseImage icetSparseImageAssignBuffer(IceTVoid *buffer,
                                            IceTSizeType width,
                                            IceTSizeType height)
{
    IceTSparseImage image;
    IceTEnum color_format, depth_format;
    IceTInt *header;

    image.opaque_internals = buffer;

    if (buffer == NULL) {
        icetRaiseError("Tried to create sparse image with NULL buffer.",
                       ICET_INVALID_VALUE);
        return image;
    }

    icetGetEnumv(ICET_COLOR_FORMAT, &color_format);
    icetGetEnumv(ICET_DEPTH_FORMAT, &depth_format);

    header = ICET_IMAGE_HEADER(image);

    if (   (color_format != ICET_IMAGE_COLOR_RGBA_UBYTE)
        && (color_format != ICET_IMAGE_COLOR_RGBA_FLOAT)
        && (color_format != ICET_IMAGE_COLOR_NONE) ) {
        icetRaiseError("Invalid color format.", ICET_INVALID_ENUM);
        color_format = ICET_IMAGE_COLOR_NONE;
    }
    if (   (depth_format != ICET_IMAGE_DEPTH_FLOAT)
        && (depth_format != ICET_IMAGE_DEPTH_NONE) ) {
        icetRaiseError("Invalid depth format.", ICET_INVALID_ENUM);
        depth_format = ICET_IMAGE_DEPTH_NONE;
    }

    header[ICET_IMAGE_MAGIC_NUM_INDEX]          = ICET_SPARSE_IMAGE_MAGIC_NUM;
    header[ICET_IMAGE_COLOR_FORMAT_INDEX]       = color_format;
    header[ICET_IMAGE_DEPTH_FORMAT_INDEX]       = depth_format;
    header[ICET_IMAGE_WIDTH_INDEX]              = (IceTInt)width;
    header[ICET_IMAGE_HEIGHT_INDEX]             = (IceTInt)height;
    header[ICET_IMAGE_MAX_NUM_PIXELS_INDEX]     = (IceTInt)(width*height);
    header[ICET_IMAGE_ACTUAL_BUFFER_SIZE_INDEX] = 0;

  /* Make sure the runlengths are valid. */
    icetClearSparseImage(image);

    return image;
}